

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O0

bool __thiscall position::in_dangerous_check(position *this)

{
  bool bVar1;
  bool local_5a;
  bool local_59;
  Color local_4c;
  Color local_48;
  Square local_44;
  bool local_3d;
  Color local_3c;
  Color CStack_38;
  bool dangerous_checker;
  int them;
  Color us;
  Square local_2c;
  int col_dist;
  Square local_24;
  int row_dist;
  Square local_1c;
  Piece piece;
  int c;
  position *this_local;
  
  _piece = this;
  bVar1 = in_check(this);
  if (bVar1) {
    if ((this->ifo).checkers == 0) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = bits::more_than_one(&(this->ifo).checkers);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        local_24 = bits::pop_lsb(&(this->ifo).checkers);
        local_1c = local_24;
        row_dist = piece_on(this,&local_24);
        local_2c = king_square(this);
        col_dist = util::row_dist((int *)&local_1c,(int *)&local_2c);
        them = king_square(this);
        us = util::col_dist((int *)&local_1c,&them);
        CStack_38 = to_move(this);
        local_4c = to_move(this);
        local_4c = local_4c ^ black;
        local_59 = true;
        if ((row_dist != 0) && (local_59 = true, row_dist != 3)) {
          local_59 = row_dist == 4;
        }
        local_3d = local_59;
        local_5a = false;
        if (((local_59 != false) && (local_5a = false, col_dist < 2)) &&
           (local_5a = false, (int)us < 2)) {
          local_44 = local_1c;
          local_48 = CStack_38;
          local_3c = local_4c;
          local_5a = is_attacked(this,&local_44,&local_48,&local_4c,0);
        }
        this_local._7_1_ = local_5a;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool position::in_dangerous_check()
{
	if (!in_check())
		return false;

	if (ifo.checkers == 0ULL)
		return false;

	if (bits::more_than_one(ifo.checkers))
		return true;

	auto c = bits::pop_lsb(ifo.checkers);
	auto piece = piece_on(Square(c));
	auto row_dist = util::row_dist(c, (int)king_square());
	auto col_dist = util::col_dist(c, (int)king_square());
	auto us = to_move();
	auto them = to_move() ^ 1;
	auto dangerous_checker = (piece == pawn || piece == rook || piece == queen);

	return dangerous_checker && row_dist <= 1 && col_dist <= 1 && is_attacked(Square(c), Color(us), Color(them));
}